

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::reset(CompilerGLSL *this,uint32_t iteration_count)

{
  ParsedIR *this_00;
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  SPIRFunction *pSVar5;
  SPIRVariable *pSVar6;
  runtime_error *this_01;
  long lVar7;
  LoopLock loop_lock;
  LoopLock local_50 [2];
  uint32_t local_40 [4];
  
  if (((this->options).force_recompile_max_debug_iterations <= iteration_count) &&
     ((this->super_Compiler).is_force_recompile_forward_progress == false)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0].lock = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,
               "Maximum compilation loops detected and no forward progress was made. Must be a SPIRV-Cross bug!"
               ,"");
    ::std::runtime_error::runtime_error(this_01,(string *)local_50);
    *(undefined ***)this_01 = &PTR__runtime_error_003f8e68;
    __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  Compiler::clear_force_recompile(&this->super_Compiler);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->super_Compiler).invalid_expressions._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->composite_insert_overwritten)._M_h);
  (this->super_Compiler).current_function = (SPIRFunction *)0x0;
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->expression_usage_counts)._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->super_Compiler).forwarded_temporaries._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->super_Compiler).suppressed_usage_tracking._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->flushed_phi_variables)._M_h);
  (this->current_emitting_switch_stack).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size = 0;
  reset_name_caches(this);
  this_00 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar2 = (this->super_Compiler).ir.ids_for_type[4].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[4].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeFunction) {
        pSVar5 = Variant::get<spirv_cross::SPIRFunction>(pVVar4 + uVar1);
        pSVar5->active = false;
        pSVar5->flush_undeclared = true;
      }
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
  }
  ParsedIR::LoopLock::~LoopLock(local_50);
  ParsedIR::create_loop_hard_lock(this_00);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        (pSVar6->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
        buffer_size = 0;
      }
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
  }
  ParsedIR::LoopLock::~LoopLock(local_50);
  ParsedIR::reset_all_of_type(this_00,TypeExpression);
  ParsedIR::reset_all_of_type(this_00,TypeAccessChain);
  this->statement_count = 0;
  this->indent = 0;
  (this->super_Compiler).current_loop_level = 0;
  return;
}

Assistant:

void CompilerGLSL::reset(uint32_t iteration_count)
{
	// Sanity check the iteration count to be robust against a certain class of bugs where
	// we keep forcing recompilations without making clear forward progress.
	// In buggy situations we will loop forever, or loop for an unbounded number of iterations.
	// Certain types of recompilations are considered to make forward progress,
	// but in almost all situations, we'll never see more than 3 iterations.
	// It is highly context-sensitive when we need to force recompilation,
	// and it is not practical with the current architecture
	// to resolve everything up front.
	if (iteration_count >= options.force_recompile_max_debug_iterations && !is_force_recompile_forward_progress)
		SPIRV_CROSS_THROW("Maximum compilation loops detected and no forward progress was made. Must be a SPIRV-Cross bug!");

	// We do some speculative optimizations which should pretty much always work out,
	// but just in case the SPIR-V is rather weird, recompile until it's happy.
	// This typically only means one extra pass.
	clear_force_recompile();

	// Clear invalid expression tracking.
	invalid_expressions.clear();
	composite_insert_overwritten.clear();
	current_function = nullptr;

	// Clear temporary usage tracking.
	expression_usage_counts.clear();
	forwarded_temporaries.clear();
	suppressed_usage_tracking.clear();

	// Ensure that we declare phi-variable copies even if the original declaration isn't deferred
	flushed_phi_variables.clear();

	current_emitting_switch_stack.clear();

	reset_name_caches();

	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, SPIRFunction &func) {
		func.active = false;
		func.flush_undeclared = true;
	});

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) { var.dependees.clear(); });

	ir.reset_all_of_type<SPIRExpression>();
	ir.reset_all_of_type<SPIRAccessChain>();

	statement_count = 0;
	indent = 0;
	current_loop_level = 0;
}